

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probabilities.cpp
# Opt level: O0

double __thiscall probabilities::probabilityPoisson(probabilities *this,int k,double deltaT)

{
  double dVar1;
  int local_3c;
  int i;
  double p;
  double temp2;
  double temp1;
  double deltaT_local;
  int k_local;
  probabilities *this_local;
  
  temp2 = 1.0;
  p = 1.0;
  for (local_3c = 1; local_3c <= k; local_3c = local_3c + 1) {
    temp2 = (this->super_Process).lambda * deltaT * temp2;
    p = (double)local_3c * p;
  }
  dVar1 = exp(-(this->super_Process).lambda * deltaT);
  return (temp2 * dVar1) / p;
}

Assistant:

double probabilities::probabilityPoisson(int k, double deltaT) {
    double temp1 = 1.0, temp2 = 1.0, p;
    for (int i = 1; i <= k; i++){
        temp1 *= lambda*deltaT;
        temp2 *= i;
    }
    p = temp1*exp(-lambda*deltaT)/temp2;

    return p;
}